

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

uint32_t handleQuantizeCloseExp(uint32_t abssrc,uint32_t tolSig,float errTol,float srcFloat)

{
  uint uVar1;
  int iVar2;
  uint in_ESI;
  uint in_EDI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  float smalldelta;
  float delta;
  int smallbits;
  int bits;
  uint32_t smallest;
  uint32_t alt;
  float alt0delta;
  float alt1delta;
  uint32_t alternates [3];
  uint32_t mask3;
  uint32_t extrabit;
  uint32_t srcMaskedVal;
  uint32_t mask2;
  uint32_t mask;
  uint32_t lowermask;
  uint32_t npow2;
  float local_58;
  int local_50;
  uint local_48;
  uint local_38;
  uint local_34;
  
  uVar1 = (uint)((in_EDI & 0x3ff) < in_ESI);
  local_34 = (uVar1 << 0xb | (uint)((uVar1 != 0 ^ 0xffU) & 1) << 9) ^ 0xfffff800;
  if ((in_EDI & 0x400) == 0) {
    if (uVar1 == 0) {
      local_38 = in_EDI & 0xfffffc00;
      local_34 = in_EDI & local_34;
    }
    else {
      local_38 = in_EDI & local_34;
      local_34 = in_EDI & 0xfffffc00;
    }
  }
  else if (uVar1 == 0) {
    local_38 = in_EDI & 0xfffff800;
    local_34 = in_EDI & local_34;
    fVar3 = half_to_float(0);
    if (in_XMM0_Da <= in_XMM1_Da - fVar3) {
      local_38 = in_EDI & 0xfffffc00;
    }
  }
  else {
    local_38 = in_EDI & local_34;
    local_34 = in_EDI & 0xfffff800;
    fVar3 = half_to_float(0);
    if (in_XMM0_Da <= in_XMM1_Da - fVar3) {
      local_34 = in_EDI & 0xfffffc00;
    }
  }
  uVar1 = in_EDI + 0x400 & 0xfffffc00;
  local_50 = countSetBits((uint16_t)in_EDI);
  iVar2 = countSetBits((uint16_t)local_38);
  local_48 = in_EDI;
  if (iVar2 < local_50) {
    fVar3 = half_to_float(0);
    local_58 = in_XMM0_Da;
    if (in_XMM1_Da - fVar3 < in_XMM0_Da) {
      local_48 = local_38;
      local_58 = in_XMM1_Da - fVar3;
      local_50 = iVar2;
    }
  }
  else {
    local_58 = in_XMM0_Da;
    if (iVar2 == local_50) {
      fVar3 = half_to_float(0);
      local_58 = in_XMM0_Da;
      if (in_XMM1_Da - fVar3 < in_XMM0_Da) {
        local_48 = local_38;
        local_58 = in_XMM1_Da - fVar3;
        local_50 = iVar2;
      }
    }
  }
  iVar2 = countSetBits((uint16_t)local_34);
  if (iVar2 < local_50) {
    fVar3 = half_to_float(0);
    if (in_XMM1_Da - fVar3 < in_XMM0_Da) {
      local_48 = local_34;
      local_58 = in_XMM1_Da - fVar3;
      local_50 = iVar2;
    }
  }
  else if (iVar2 == local_50) {
    fVar3 = half_to_float(0);
    if (in_XMM1_Da - fVar3 < local_58) {
      local_48 = local_34;
      local_58 = in_XMM1_Da - fVar3;
      local_50 = iVar2;
    }
  }
  iVar2 = countSetBits((uint16_t)uVar1);
  if (iVar2 < local_50) {
    fVar3 = half_to_float(0);
    if (fVar3 - in_XMM1_Da < in_XMM0_Da) {
      local_48 = uVar1;
    }
  }
  else if ((iVar2 == local_50) && (fVar3 = half_to_float(0), fVar3 - in_XMM1_Da < local_58)) {
    local_48 = uVar1;
  }
  return local_48;
}

Assistant:

static uint32_t handleQuantizeCloseExp (
    uint32_t abssrc, uint32_t tolSig, float errTol, float srcFloat)
{
    const uint32_t npow2 = 0x0400;
    const uint32_t lowermask = npow2 - 1;
    const uint32_t mask = ~lowermask;
    const uint32_t mask2 = mask ^ npow2;

    const uint32_t srcMaskedVal = abssrc & lowermask;
    const uint32_t extrabit = (tolSig > srcMaskedVal);

    const uint32_t mask3 = mask2 ^ (((npow2 << 1) * (extrabit)) |
                                    ((npow2 >> 1) * (!extrabit)));

    uint32_t alternates[3];

    if ((abssrc & npow2) == 0) // by definition, src&mask2 == src&mask
    {
        if (extrabit)
        {
            alternates[0] = (abssrc & mask3);
            alternates[1] = (abssrc & mask);
        }
        else
        {
            alternates[0] = (abssrc & mask);
            alternates[1] = (abssrc & mask3);
        }
    }
    else
    {
        if (extrabit)
        {
            alternates[0] = (abssrc & mask3);
            alternates[1] = (abssrc & mask2);
            float alt1delta = srcFloat - half_to_float ((uint16_t)alternates[1]);
            if (alt1delta >= errTol)
            {
                alternates[1] = (abssrc & mask);
            }
        }
        else
        {
            alternates[0] = (abssrc & mask2);
            alternates[1] = (abssrc & mask3);
            float alt0delta = srcFloat - half_to_float ((uint16_t)alternates[0]);
            if (alt0delta >= errTol)
                alternates[0] = (abssrc & mask);
        }
    }
    alternates[2] = ((abssrc + npow2) & mask);

    uint32_t alt, smallest = abssrc;
    int bits, smallbits = countSetBits(abssrc);
    float delta, smalldelta = errTol;

    TEST_QUANT_ALTERNATE_SMALL(alternates[0]);
    TEST_QUANT_ALTERNATE_SMALL(alternates[1]);
    TEST_QUANT_ALTERNATE_LARGE(alternates[2]);

    return smallest;
}